

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGImpactCollisionAlgorithm.cpp
# Opt level: O0

void __thiscall
btGImpactCollisionAlgorithm::gimpact_vs_compoundshape
          (btGImpactCollisionAlgorithm *this,btCollisionObjectWrapper *body0Wrap,
          btCollisionObjectWrapper *body1Wrap,btGImpactShapeInterface *shape0,
          btCompoundShape *shape1,bool swapped)

{
  btCollisionShape *shape;
  btCollisionObject *pbVar1;
  btCollisionObjectWrapper *pbVar2;
  btCollisionObject *pbVar3;
  int index;
  btCollisionObjectWrapper *in_RDX;
  long in_RDI;
  btCollisionObjectWrapper *tmp;
  btCollisionObjectWrapper ob1;
  btTransform childtrans1;
  btCollisionShape *colshape1;
  int i;
  btTransform orgtrans1;
  undefined1 in_stack_000002ef;
  btCollisionShape *in_stack_000002f0;
  btGImpactShapeInterface *in_stack_000002f8;
  btCollisionObjectWrapper *in_stack_00000300;
  btCollisionObjectWrapper *in_stack_00000308;
  btGImpactCollisionAlgorithm *in_stack_00000310;
  undefined4 in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  btCollisionObject *in_stack_fffffffffffffef0;
  btCollisionObjectWrapper *local_e8;
  btTransform *in_stack_ffffffffffffff40;
  btTransform *in_stack_ffffffffffffff48;
  int local_70;
  
  btCollisionObjectWrapper::getWorldTransform(in_RDX);
  btTransform::btTransform
            ((btTransform *)in_stack_fffffffffffffef0,
             (btTransform *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  local_70 = btCompoundShape::getNumChildShapes((btCompoundShape *)0x1d2f12);
  while (index = local_70 + -1, local_70 != 0) {
    shape = btCompoundShape::getChildShape
                      ((btCompoundShape *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    btCompoundShape::getChildTransform
              ((btCompoundShape *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    btTransform::operator*(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    pbVar1 = btCollisionObjectWrapper::getCollisionObject(in_RDX);
    btCollisionObjectWrapper::btCollisionObjectWrapper
              ((btCollisionObjectWrapper *)&stack0xffffffffffffff20,in_RDX,shape,pbVar1,
               (btTransform *)&stack0xffffffffffffff48,-1,index);
    pbVar2 = btManifoldResult::getBody0Wrap(*(btManifoldResult **)(in_RDI + 0x20));
    pbVar1 = btCollisionObjectWrapper::getCollisionObject(pbVar2);
    pbVar3 = btCollisionObjectWrapper::getCollisionObject
                       ((btCollisionObjectWrapper *)&stack0xffffffffffffff20);
    if (pbVar1 == pbVar3) {
      local_e8 = btManifoldResult::getBody0Wrap(*(btManifoldResult **)(in_RDI + 0x20));
      btManifoldResult::setBody0Wrap
                (*(btManifoldResult **)(in_RDI + 0x20),
                 (btCollisionObjectWrapper *)&stack0xffffffffffffff20);
    }
    else {
      local_e8 = btManifoldResult::getBody1Wrap(*(btManifoldResult **)(in_RDI + 0x20));
      btManifoldResult::setBody1Wrap
                (*(btManifoldResult **)(in_RDI + 0x20),
                 (btCollisionObjectWrapper *)&stack0xffffffffffffff20);
    }
    gimpact_vs_shape(in_stack_00000310,in_stack_00000308,in_stack_00000300,in_stack_000002f8,
                     in_stack_000002f0,(bool)in_stack_000002ef);
    pbVar2 = btManifoldResult::getBody0Wrap(*(btManifoldResult **)(in_RDI + 0x20));
    in_stack_fffffffffffffef0 = btCollisionObjectWrapper::getCollisionObject(pbVar2);
    pbVar1 = btCollisionObjectWrapper::getCollisionObject
                       ((btCollisionObjectWrapper *)&stack0xffffffffffffff20);
    local_70 = index;
    if (in_stack_fffffffffffffef0 == pbVar1) {
      btManifoldResult::setBody0Wrap(*(btManifoldResult **)(in_RDI + 0x20),local_e8);
    }
    else {
      btManifoldResult::setBody1Wrap(*(btManifoldResult **)(in_RDI + 0x20),local_e8);
    }
  }
  return;
}

Assistant:

void btGImpactCollisionAlgorithm::gimpact_vs_compoundshape(const btCollisionObjectWrapper* body0Wrap,
				  const btCollisionObjectWrapper* body1Wrap,
				  const btGImpactShapeInterface * shape0,
				  const btCompoundShape * shape1,bool swapped)
{
	btTransform orgtrans1 = body1Wrap->getWorldTransform();

	int i = shape1->getNumChildShapes();
	while(i--)
	{

		const btCollisionShape * colshape1 = shape1->getChildShape(i);
		btTransform childtrans1 = orgtrans1*shape1->getChildTransform(i);

		btCollisionObjectWrapper ob1(body1Wrap,colshape1,body1Wrap->getCollisionObject(),childtrans1,-1,i);
		
		const btCollisionObjectWrapper* tmp = 0;
		if (m_resultOut->getBody0Wrap()->getCollisionObject()==ob1.getCollisionObject())
		{
			tmp = m_resultOut->getBody0Wrap();
			m_resultOut->setBody0Wrap(&ob1);
		} else
		{
			tmp = m_resultOut->getBody1Wrap();
			m_resultOut->setBody1Wrap(&ob1);
		}
		//collide child shape
		gimpact_vs_shape(body0Wrap, &ob1,
					  shape0,colshape1,swapped);

		if (m_resultOut->getBody0Wrap()->getCollisionObject()==ob1.getCollisionObject())
		{
			m_resultOut->setBody0Wrap(tmp);
		} else
		{
			m_resultOut->setBody1Wrap(tmp);
		}
	}
}